

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clCommandCopyBufferKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem src_buffer,cl_mem dst_buffer,
                 size_t src_offset,size_t dst_offset,size_t size,
                 cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
                 cl_sync_point_khr *sync_point,cl_mutable_command_khr *mutable_handle)

{
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  byte bVar1;
  cl_int errorCode;
  CLdispatchX *pCVar2;
  time_point end;
  allocator local_99;
  time_point local_98;
  uint64_t local_90;
  string local_88;
  cl_mem local_68;
  cl_mem local_60;
  size_t local_58;
  string syncPointWaitList;
  
  pIntercept = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  local_68 = src_buffer;
  local_60 = dst_buffer;
  local_58 = src_offset;
  pCVar2 = CLIntercept::dispatchX(g_pIntercept,command_buffer);
  if (pCVar2->clCommandCopyBufferKHR ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_cl_mem_size_t_size_t_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) {
    return -0x472;
  }
  enqueueCounter = (pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  getFormattedSyncPointWaitList_abi_cxx11_
            (&syncPointWaitList,pIntercept,num_sync_points_in_wait_list,sync_point_wait_list);
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (pIntercept,"clCommandCopyBufferKHR",enqueueCounter,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p%s",command_buffer,command_queue,
               syncPointWaitList._M_dataplus._M_p);
  }
  local_90 = enqueueCounter;
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar2->clCommandCopyBufferKHR)
                        (command_buffer,command_queue,properties,local_68,local_60,local_58,
                         dst_offset,size,num_sync_points_in_wait_list,sync_point_wait_list,
                         sync_point,mutable_handle);
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((pIntercept->m_Config).HostPerformanceTiming == true) &&
       (((pIntercept->m_Config).HostPerformanceTimingMinEnqueue <= local_90 &&
        (local_90 <= (pIntercept->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_88,"",&local_99);
      CLIntercept::updateHostTimingStats(pIntercept,"clCommandCopyBufferKHR",&local_88,local_98,end)
      ;
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  if ((pIntercept->m_Config).ErrorLogging == false) {
    bVar1 = (pIntercept->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((pIntercept->m_Config).NoErrors == false)) goto LAB_00139d11;
    }
    else if (errorCode == 0) goto LAB_00139ce6;
  }
  else {
    if (errorCode == 0) {
LAB_00139ce6:
      errorCode = 0;
      goto LAB_00139d11;
    }
    CLIntercept::logError(pIntercept,"clCommandCopyBufferKHR",errorCode);
    bVar1 = (pIntercept->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((pIntercept->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00139d11:
  if (((command_buffer != (cl_command_buffer_khr)0x0) && (errorCode == 0)) &&
     ((pIntercept->m_Config).DumpCommandBuffers == true)) {
    std::__cxx11::string::string((string *)&local_88,"",&local_99);
    CLIntercept::recordCommandBufferCommand
              (pIntercept,command_buffer,"clCommandCopyBufferKHR",&local_88,
               num_sync_points_in_wait_list,sync_point_wait_list,sync_point);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (pIntercept,"clCommandCopyBufferKHR",errorCode,(cl_event *)0x0,sync_point);
  }
  if ((pIntercept->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_88,"",&local_99);
    CLIntercept::chromeCallLoggingExit
              (pIntercept,"clCommandCopyBufferKHR",&local_88,true,local_90,local_98,end);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((mutable_handle != (cl_mutable_command_khr *)0x0) &&
     (*mutable_handle != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo(pIntercept,*mutable_handle,command_buffer,0);
  }
  std::__cxx11::string::~string((string *)&syncPointWaitList);
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandCopyBufferKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem src_buffer,
    cl_mem dst_buffer,
    size_t src_offset,
    size_t dst_offset,
    size_t size,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandCopyBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p%s",
                command_buffer,
                command_queue,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandCopyBufferKHR(
                command_buffer,
                command_queue,
                properties,
                src_buffer,
                dst_buffer,
                src_offset,
                dst_offset,
                size,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}